

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_i2d_fp.cc
# Opt level: O1

int ASN1_item_i2d_bio(ASN1_ITEM *it,BIO *out,void *x)

{
  int iVar1;
  uchar *b;
  uchar *local_18;
  
  local_18 = (uchar *)0x0;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)x,&local_18,it);
  if (local_18 == (uchar *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = BIO_write_all((BIO *)out,local_18,(long)iVar1);
    OPENSSL_free(local_18);
  }
  return iVar1;
}

Assistant:

int ASN1_item_i2d_bio(const ASN1_ITEM *it, BIO *out, void *x) {
  unsigned char *b = NULL;
  int n = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(x), &b, it);
  if (b == NULL) {
    return 0;
  }

  int ret = BIO_write_all(out, b, n);
  OPENSSL_free(b);
  return ret;
}